

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O0

Component __thiscall
ftxui::ResizableSplitBottom(ftxui *this,Component *main,Component *back,int *main_size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  shared_ptr<ftxui::(anonymous_namespace)::ResizableSplitBottomBase> local_38;
  int *local_28;
  int *main_size_local;
  Component *back_local;
  Component *main_local;
  
  local_28 = main_size;
  main_size_local = (int *)back;
  back_local = main;
  main_local = (Component *)this;
  Make<ftxui::(anonymous_namespace)::ResizableSplitBottomBase,std::shared_ptr<ftxui::ComponentBase>,std::shared_ptr<ftxui::ComponentBase>,int*&>
            ((shared_ptr<ftxui::ComponentBase> *)&local_38,main,(int **)back);
  std::shared_ptr<ftxui::ComponentBase>::
  shared_ptr<ftxui::(anonymous_namespace)::ResizableSplitBottomBase,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,&local_38);
  std::shared_ptr<ftxui::(anonymous_namespace)::ResizableSplitBottomBase>::~shared_ptr(&local_38);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component ResizableSplitBottom(Component main, Component back, int* main_size) {
  return Make<ResizableSplitBottomBase>(std::move(main), std::move(back),
                                        main_size);
}